

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O0

void __thiscall
baryonyx::itm::
solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
::solver_inequalities_01coeff
          (solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  int iVar1;
  bool bVar2;
  const_reference pvVar3;
  type pbVar4;
  int *piVar5;
  debug_logger<true> *in_stack_000001c8;
  undefined1 in_stack_000001d0 [16];
  int local_78 [2];
  reference local_70;
  function_element *cst;
  const_iterator __end4;
  const_iterator __begin4;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range4;
  int i;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *local_30;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *csts_local;
  cost_type *c__local;
  int n__local;
  int m__local;
  random_engine *rng__local;
  solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  *this_local;
  
  local_30 = csts;
  csts_local = (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)c_;
  c__local._0_4_ = n_;
  c__local._4_4_ = m_;
  _n__local = rng_;
  rng__local = (random_engine *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"solver_inequalities_01coeff");
  debug_logger<true>::debug_logger(in_stack_000001c8,(string_view)in_stack_000001d0);
  this->rng = _n__local;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>
            (&this->ap,local_30,c__local._4_4_,(int)c__local);
  sparse_matrix<int>::size(&this->ap);
  std::make_unique<long_double[]>((size_t)&this->P);
  compute_reduced_costs_vector_size(local_30);
  std::
  make_unique<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[]>
            ((size_t)&this->R);
  std::
  make_unique<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::bound_factor[]>
            ((size_t)&this->b);
  std::make_unique<long_double[]>((size_t)&this->pi);
  this->c = (cost_type *)csts_local;
  this->m = c__local._4_4_;
  this->n = (int)c__local;
  __range4._0_4_ = 0;
  while( true ) {
    if ((int)__range4 == this->m) {
      return;
    }
    pvVar3 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](local_30,(long)(int)__range4);
    __end4 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
             begin(&pvVar3->elements);
    cst = (function_element *)
          std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::end
                    (&pvVar3->elements);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                        (&__end4,(__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                  *)&cst);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      local_70 = __gnu_cxx::
                 __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                 ::operator*(&__end4);
      if (local_70->factor != 1) {
        details::fail_fast("Postcondition","cst.factor == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-01.cpp"
                           ,"94");
      }
      __gnu_cxx::
      __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
      ::operator++(&__end4);
    }
    pvVar3 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](local_30,(long)(int)__range4);
    iVar1 = pvVar3->min;
    pvVar3 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](local_30,(long)(int)__range4);
    if (iVar1 == pvVar3->max) {
      pvVar3 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)(int)__range4);
      iVar1 = pvVar3->min;
      pbVar4 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
               ::operator[](&this->b,(long)(int)__range4);
      pbVar4->min = iVar1;
      pvVar3 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)(int)__range4);
      iVar1 = pvVar3->max;
      pbVar4 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
               ::operator[](&this->b,(long)(int)__range4);
      pbVar4->max = iVar1;
    }
    else {
      local_78[1] = 0;
      pvVar3 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)(int)__range4);
      piVar5 = std::max<int>(local_78 + 1,&pvVar3->min);
      iVar1 = *piVar5;
      pbVar4 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
               ::operator[](&this->b,(long)(int)__range4);
      pbVar4->min = iVar1;
      pvVar3 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)(int)__range4);
      local_78[0] = length<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                              (&pvVar3->elements);
      pvVar3 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)(int)__range4);
      piVar5 = std::min<int>(local_78,&pvVar3->max);
      iVar1 = *piVar5;
      pbVar4 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
               ::operator[](&this->b,(long)(int)__range4);
      pbVar4->max = iVar1;
    }
    pbVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
             ::operator[](&this->b,(long)(int)__range4);
    iVar1 = pbVar4->min;
    pbVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
             ::operator[](&this->b,(long)(int)__range4);
    if (pbVar4->max < iVar1) break;
    __range4._0_4_ = (int)__range4 + 1;
  }
  details::fail_fast("Postcondition","b[i].min <= b[i].max",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-01.cpp"
                     ,"105");
}

Assistant:

solver_inequalities_01coeff(random_engine& rng_,
                                int m_,
                                int n_,
                                const cost_type& c_,
                                const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_01coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        for (int i = 0; i != m; ++i) {
#if !defined(BARYONYX_FULL_OPTIMIZATION)
            // mscv 15.9.6 fail to build this line:
            // for ([[maybe_unused]] const auto& cst : csts[i].elements)
            //    bx_ensures(cst.factor == 1);
            for (const auto& cst : csts[i].elements)
                bx_ensures(cst.factor == 1);
#endif

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(0, csts[i].min);
                b[i].max = std::min(length(csts[i].elements), csts[i].max);
            }

            bx_ensures(b[i].min <= b[i].max);
        }
    }